

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

int __thiscall Catch::Session::run<char>(Session *this,int argc,char **argv)

{
  int local_2c;
  int returnCode;
  char **argv_local;
  int argc_local;
  Session *this_local;
  
  if ((this->m_startupExceptions & 1U) == 0) {
    local_2c = applyCommandLine(this,argc,argv);
    if (local_2c == 0) {
      local_2c = run(this);
    }
    this_local._4_4_ = local_2c;
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int run(int argc, CharT const * const argv[]) {
            if (m_startupExceptions)
                return 1;
            int returnCode = applyCommandLine(argc, argv);
            if (returnCode == 0)
                returnCode = run();
            return returnCode;
        }